

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::add_tess_level_input_to_interface_block
          (CompilerMSL *this,string *ib_var_ref,SPIRType *ib_type,SPIRVariable *var)

{
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *pSVar1;
  bool bVar2;
  uint32_t uVar3;
  TypedID<(spirv_cross::Types)1> TVar4;
  size_t sVar5;
  SPIRType *args;
  TypedID<(spirv_cross::Types)1> local_e8;
  TypedID<(spirv_cross::Types)1> local_e4;
  SPIRType *local_e0;
  SPIRType *new_var_type;
  uint32_t ptr_type_id;
  uint32_t type_id_1;
  uint32_t local_ac;
  uint32_t local_a8;
  TypedID<(spirv_cross::Types)1> local_a4;
  uint32_t local_a0;
  uint32_t type_id;
  undefined1 local_90 [8];
  anon_class_40_5_c1147381 mark_locations;
  uint32_t ib_mbr_idx;
  string mbr_name;
  uint32_t uStack_34;
  bool triangles;
  SPIRType *pSStack_30;
  BuiltIn builtin;
  SPIRType *var_type;
  SPIRVariable *var_local;
  SPIRType *ib_type_local;
  string *ib_var_ref_local;
  CompilerMSL *this_local;
  
  var_type = (SPIRType *)var;
  var_local = (SPIRVariable *)ib_type;
  ib_type_local = (SPIRType *)ib_var_ref;
  ib_var_ref_local = (string *)this;
  pSStack_30 = Compiler::get_variable_element_type((Compiler *)this,var);
  uStack_34 = Compiler::get_decoration
                        ((Compiler *)this,(ID)(var_type->super_IVariant).self.id,DecorationBuiltIn);
  bVar2 = Compiler::is_tessellating_triangles((Compiler *)this);
  ::std::__cxx11::string::string((string *)&stack0xffffffffffffffa0);
  sVar5 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                    ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                     ((var_local->dependees).stack_storage.aligned_char + 0x10));
  mark_locations.builtin._4_4_ = (uint32_t)sVar5;
  mark_locations.this = (CompilerMSL *)var_type;
  mark_locations.var = var_local;
  mark_locations.ib_type = (SPIRType *)((long)&mark_locations.builtin + 4);
  mark_locations.ib_mbr_idx = &stack0xffffffffffffffcc;
  local_90 = (undefined1  [8])this;
  if (bVar2) {
    ::std::__cxx11::string::operator=((string *)&stack0xffffffffffffffa0,"gl_TessLevel");
    if ((this->added_builtin_tess_level & 1U) == 0) {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_30->super_IVariant).self);
      local_a0 = build_extended_vector_type(this,uVar3,4,Unknown);
      pSVar1 = &var_local->dependees;
      TypedID<(spirv_cross::Types)1>::TypedID(&local_a4,local_a0);
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                 ((pSVar1->stack_storage).aligned_char + 0x10),&local_a4);
      local_a8 = (uint32_t)
                 TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
      Compiler::set_member_name
                ((Compiler *)this,(TypeID)local_a8,mark_locations.builtin._4_4_,
                 (string *)&stack0xffffffffffffffa0);
      local_ac = (uint32_t)
                 TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)local_ac,mark_locations.builtin._4_4_,DecorationBuiltIn,
                 uStack_34);
      add_tess_level_input_to_interface_block::anon_class_40_5_c1147381::operator()
                ((anon_class_40_5_c1147381 *)local_90,pSStack_30);
      this->added_builtin_tess_level = true;
    }
  }
  else {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
              (&ptr_type_id,this,(ulong)uStack_34,7);
    ::std::__cxx11::string::operator=((string *)&stack0xffffffffffffffa0,(string *)&ptr_type_id);
    ::std::__cxx11::string::~string((string *)&ptr_type_id);
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_30->super_IVariant).self);
    new_var_type._4_4_ =
         build_extended_vector_type
                   (this,uVar3,(uStack_34 == 0xb) + 2 + (uint)(uStack_34 == 0xb),Unknown);
    uVar3 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
    new_var_type._0_4_ = uVar3;
    args = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,new_var_type._4_4_);
    local_e0 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                         ((Compiler *)this,uVar3,args);
    local_e0->pointer = true;
    local_e0->pointer_depth = local_e0->pointer_depth + 1;
    local_e0->storage = StorageClassInput;
    TypedID<(spirv_cross::Types)1>::TypedID(&local_e4,new_var_type._4_4_);
    (local_e0->parent_type).id = local_e4.id;
    pSVar1 = &var_local->dependees;
    TypedID<(spirv_cross::Types)1>::TypedID(&local_e8,new_var_type._4_4_);
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
              ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
               ((pSVar1->stack_storage).aligned_char + 0x10),&local_e8);
    TVar4 = TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
    Compiler::set_member_name
              ((Compiler *)this,(TypeID)TVar4.id,mark_locations.builtin._4_4_,
               (string *)&stack0xffffffffffffffa0);
    TVar4 = TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)TVar4.id,mark_locations.builtin._4_4_,DecorationBuiltIn,
               uStack_34);
    add_tess_level_input_to_interface_block::anon_class_40_5_c1147381::operator()
              ((anon_class_40_5_c1147381 *)local_90,local_e0);
  }
  add_tess_level_input
            (this,(string *)ib_type_local,(string *)&stack0xffffffffffffffa0,
             (SPIRVariable *)var_type);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  return;
}

Assistant:

void CompilerMSL::add_tess_level_input_to_interface_block(const std::string &ib_var_ref, SPIRType &ib_type,
                                                          SPIRVariable &var)
{
	auto &var_type = get_variable_element_type(var);

	BuiltIn builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
	bool triangles = is_tessellating_triangles();
	string mbr_name;

	// Add a reference to the variable type to the interface struct.
	uint32_t ib_mbr_idx = uint32_t(ib_type.member_types.size());

	const auto mark_locations = [&](const SPIRType &new_var_type) {
		if (get_decoration_bitset(var.self).get(DecorationLocation))
		{
			uint32_t locn = get_decoration(var.self, DecorationLocation);
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
			mark_location_as_used_by_shader(locn, new_var_type, StorageClassInput);
		}
		else if (inputs_by_builtin.count(builtin))
		{
			uint32_t locn = inputs_by_builtin[builtin].location;
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
			mark_location_as_used_by_shader(locn, new_var_type, StorageClassInput);
		}
	};

	if (triangles)
	{
		// Triangles are tricky, because we want only one member in the struct.
		mbr_name = "gl_TessLevel";

		// If we already added the other one, we can skip this step.
		if (!added_builtin_tess_level)
		{
			uint32_t type_id = build_extended_vector_type(var_type.self, 4);

			ib_type.member_types.push_back(type_id);

			// Give the member a name
			set_member_name(ib_type.self, ib_mbr_idx, mbr_name);

			// We cannot decorate both, but the important part is that
			// it's marked as builtin so we can get automatic attribute assignment if needed.
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationBuiltIn, builtin);

			mark_locations(var_type);
			added_builtin_tess_level = true;
		}
	}
	else
	{
		mbr_name = builtin_to_glsl(builtin, StorageClassFunction);

		uint32_t type_id = build_extended_vector_type(var_type.self, builtin == BuiltInTessLevelOuter ? 4 : 2);

		uint32_t ptr_type_id = ir.increase_bound_by(1);
		auto &new_var_type = set<SPIRType>(ptr_type_id, get<SPIRType>(type_id));
		new_var_type.pointer = true;
		new_var_type.pointer_depth++;
		new_var_type.storage = StorageClassInput;
		new_var_type.parent_type = type_id;

		ib_type.member_types.push_back(type_id);

		// Give the member a name
		set_member_name(ib_type.self, ib_mbr_idx, mbr_name);
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationBuiltIn, builtin);

		mark_locations(new_var_type);
	}

	add_tess_level_input(ib_var_ref, mbr_name, var);
}